

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQInstance::Finalize(SQInstance *this)

{
  SQUnsignedInteger SVar1;
  long local_20;
  SQInteger _n_;
  SQUnsignedInteger nvalues;
  SQInstance *this_local;
  
  SVar1 = sqvector<SQClassMember>::size(&this->_class->_defaultvalues);
  if (this->_class != (SQClass *)0x0) {
    (this->_class->super_SQCollectable).super_SQRefCounted._uiRef =
         (this->_class->super_SQCollectable).super_SQRefCounted._uiRef - 1;
    if ((this->_class->super_SQCollectable).super_SQRefCounted._uiRef == 0) {
      (*(this->_class->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_class = (SQClass *)0x0;
  }
  for (local_20 = 0; local_20 < (long)SVar1; local_20 = local_20 + 1) {
    ::SQObjectPtr::Null(this->_values + local_20);
  }
  return;
}

Assistant:

void SQInstance::Finalize()
{
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    __ObjRelease(_class);
    _NULL_SQOBJECT_VECTOR(_values,nvalues);
}